

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_pack.c
# Opt level: O0

void upack_loc(char **buf,LocMsg *lmsg)

{
  ck_uint32 cVar1;
  char *pcVar2;
  ck_uint32 line;
  LocMsg *lmsg_local;
  char **buf_local;
  
  pcVar2 = upack_str(buf);
  lmsg->file = pcVar2;
  cVar1 = upack_int(buf);
  if (0x7fffffff < cVar1) {
    eprintf("Unpacked value (%u) too big for lmsg->line, max allowed %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/libs/check/src/check_pack.c"
            ,0x13f,(ulong)cVar1,0x7fffffff);
  }
  lmsg->line = cVar1;
  return;
}

Assistant:

static void upack_loc(char **buf, LocMsg * lmsg)
{
    ck_uint32 line;
    lmsg->file = upack_str(buf);
    line = upack_int(buf);
    if(line > INT_MAX)
        eprintf("Unpacked value (%u) too big for lmsg->line, max allowed %d\n",
                __FILE__, __LINE__ - 3, line, INT_MAX);
    lmsg->line = (int) line;
}